

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * sym_AddEqu(char *symName,int32_t value)

{
  Symbol *sym;
  int32_t value_local;
  char *symName_local;
  
  symName_local = createNonrelocSymbol(symName,true)->name;
  if ((Symbol *)symName_local == (Symbol *)0x0) {
    symName_local = (char *)0x0;
  }
  else {
    ((Symbol *)symName_local)->type = SYM_EQU;
    (((Symbol *)symName_local)->field_8).value = value;
  }
  return (Symbol *)symName_local;
}

Assistant:

struct Symbol *sym_AddEqu(char const *symName, int32_t value)
{
	struct Symbol *sym = createNonrelocSymbol(symName, true);

	if (!sym)
		return NULL;

	sym->type = SYM_EQU;
	sym->value = value;

	return sym;
}